

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::ProcessBailOnStackArgsOutOfActualsRange(BackwardPass *this)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  
  if (this->tag != DeadStorePhase) {
    return;
  }
  this_00 = this->currentInstr;
  if ((this_00->m_opcode != LdElemI_A) && (this_00->m_opcode != TypeofElem)) {
    return;
  }
  if ((this_00->field_0x38 & 0x10) == 0) {
    return;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return;
  }
  bVar2 = IR::Instr::DoStackArgsOpt(this_00);
  BVar3 = IR::Instr::GetBailOutKind(this_00);
  if (bVar2) {
    if ((BVar3 >> 0x14 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x14d,"(instr->GetBailOutKind() & IR::BailOnStackArgsOutOfActualsRange)",
                         "Stack args bail out is not set when the optimization is turned on? ");
      if (!bVar2) goto LAB_003d6606;
      *puVar4 = 0;
    }
    BVar3 = IR::Instr::GetBailOutKind(this_00);
    if ((BVar3 & ~BailOnStackArgsOutOfActualsRange) == BailOutInvalid) {
      return;
    }
    BVar3 = IR::Instr::GetBailOutKind(this_00);
    if ((BVar3 & ~(LazyBailOut|BailOutOnImplicitCallsPreOp)) != BailOnStackArgsOutOfActualsRange) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x151,
                         "((BailOutInfo::WithoutLazyBailOut(instr->GetBailOutKind() & ~IR::BailOutOnImplicitCallsPreOp)) == IR::BailOnStackArgsOutOfActualsRange)"
                         ,
                         "(BailOutInfo::WithoutLazyBailOut(instr->GetBailOutKind() & ~IR::BailOutOnImplicitCallsPreOp)) == IR::BailOnStackArgsOutOfActualsRange"
                        );
      if (!bVar2) {
LAB_003d6606:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    BVar3 = BailOnStackArgsOutOfActualsRange;
  }
  else {
    if ((BVar3 >> 0x14 & 1) == 0) {
      return;
    }
    BVar3 = IR::Instr::GetBailOutKind(this_00);
    BVar3 = BVar3 & ~BailOnStackArgsOutOfActualsRange;
    if (BVar3 == BailOutInvalid) {
      IR::Instr::ClearBailOutInfo(this_00);
      return;
    }
  }
  IR::Instr::SetBailOutKind(this_00,BVar3);
  return;
}

Assistant:

void
BackwardPass::ProcessBailOnStackArgsOutOfActualsRange()
{
    IR::Instr * instr = this->currentInstr;

    if (tag == Js::DeadStorePhase &&
        (instr->m_opcode == Js::OpCode::LdElemI_A || instr->m_opcode == Js::OpCode::TypeofElem) &&
        instr->HasBailOutInfo() && !IsPrePass())
    {
        if (instr->DoStackArgsOpt())
        {
            AssertMsg(instr->GetBailOutKind() & IR::BailOnStackArgsOutOfActualsRange, "Stack args bail out is not set when the optimization is turned on? ");
            if (instr->GetBailOutKind() & ~IR::BailOnStackArgsOutOfActualsRange)
            {
                //Make sure that in absence of potential LazyBailOut and BailOutOnImplicitCallsPreOp, we only have BailOnStackArgsOutOfActualsRange bit set
                Assert((BailOutInfo::WithoutLazyBailOut(instr->GetBailOutKind() & ~IR::BailOutOnImplicitCallsPreOp)) == IR::BailOnStackArgsOutOfActualsRange);
                //We are sure at this point, that we will not have any implicit calls as we wouldn't have done this optimization in the first place.
                instr->SetBailOutKind(IR::BailOnStackArgsOutOfActualsRange);
            }
        }
        else if (instr->GetBailOutKind() & IR::BailOnStackArgsOutOfActualsRange)
        {
            //If we don't decide to do StackArgs, then remove the bail out at this point.
            //We would have optimistically set the bailout in the forward pass, and by the end of forward pass - we
            //turned off stack args for some reason. So we are removing it in the deadstore pass.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind() & ~IR::BailOnStackArgsOutOfActualsRange;
            if (bailOutKind == IR::BailOutInvalid)
            {
                instr->ClearBailOutInfo();
            }
            else
            {
                instr->SetBailOutKind(bailOutKind);
            }
        }
    }
}